

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O0

Value * __thiscall
ot::commissioner::Interpreter::ProcessBbrDatasetJob
          (Value *__return_storage_ptr__,Interpreter *this,CommissionerAppPtr *aCommissioner,
          Expression *aExpr)

{
  bool bVar1;
  size_type sVar2;
  const_reference pvVar3;
  element_type *peVar4;
  Value *pVVar5;
  BbrDataset *aDataset;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  basic_string_view<char> bVar6;
  string_view fmt;
  string_view fmt_00;
  string_view fmt_01;
  string_view fmt_02;
  string_view fmt_03;
  string_view fmt_04;
  string_view fmt_05;
  format_args args;
  format_args args_00;
  format_args args_01;
  format_args args_02;
  format_args args_03;
  format_args args_04;
  format_args args_05;
  anon_class_1_0_00000001 local_1102;
  v10 local_1101;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1100;
  char *local_10f8;
  string local_10f0;
  Error local_10d0;
  Value local_10a8;
  ErrorCode local_105c;
  Error local_1058;
  Value local_1030;
  ErrorCode local_fe4;
  Error local_fe0;
  Value local_fb8;
  undefined1 local_f70 [8];
  BbrDataset dataset_1;
  Value local_ee8;
  ErrorCode local_e9c;
  Error local_e98;
  Value local_e70;
  anon_class_1_0_00000001 local_e22;
  v10 local_e21;
  v10 *local_e20;
  size_t local_e18;
  string local_e10;
  Error local_df0;
  Value local_dc8;
  string local_d80 [8];
  string regAddr;
  string local_d58;
  string local_d38;
  Value local_d18;
  ErrorCode local_ccc;
  Error local_cc8;
  Value local_ca0;
  ErrorCode local_c54;
  Error local_c50;
  Value local_c28;
  anon_class_1_0_00000001 local_bda;
  v10 local_bd9;
  v10 *local_bd8;
  size_t local_bd0;
  string local_bc8;
  Error local_ba8;
  Value local_b80;
  string local_b38 [8];
  string regHostname;
  string local_b10;
  string local_af0;
  Value local_ad0;
  ErrorCode local_a84;
  Error local_a80;
  Value local_a58;
  ErrorCode local_a0c;
  Error local_a08;
  Value local_9e0;
  anon_class_1_0_00000001 local_992;
  v10 local_991;
  v10 *local_990;
  size_t local_988;
  string local_980;
  Error local_960;
  Value local_938;
  string local_8f0 [8];
  string triHostname;
  string local_8c8;
  anon_class_1_0_00000001 local_8a2;
  v10 local_8a1;
  v10 *local_8a0;
  size_t local_898;
  string local_890;
  Error local_870;
  Value local_848;
  int local_7fc;
  string local_7f8;
  Value local_7d8;
  ErrorCode local_78c;
  Error local_788;
  Value local_760;
  undefined1 local_718 [8];
  BbrDataset dataset;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_6a8;
  char *local_6a0;
  string local_698;
  Error local_678;
  Value local_650;
  allocator local_601;
  string local_600;
  allocator local_5d9;
  string local_5d8;
  anon_class_1_0_00000001 local_5a2;
  v10 local_5a1;
  v10 *local_5a0;
  size_t local_598;
  string local_590;
  Error local_570;
  Value local_548;
  byte local_4fa;
  byte local_4f9;
  bool isSet;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvStack_4f8;
  Expression *aExpr_local;
  CommissionerAppPtr *aCommissioner_local;
  Interpreter *this_local;
  Value *value;
  undefined1 local_4c0 [16];
  v10 *local_4b0;
  ulong local_4a8;
  v10 *local_4a0;
  size_t sStack_498;
  string *local_490;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *local_488 [3];
  undefined1 local_470 [16];
  v10 *local_460;
  ulong local_458;
  v10 *local_450;
  size_t sStack_448;
  string *local_440;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *local_438 [3];
  undefined1 local_420 [16];
  v10 *local_410;
  ulong local_408;
  v10 *local_400;
  size_t sStack_3f8;
  string *local_3f0;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *local_3e8 [3];
  undefined1 local_3d0 [16];
  v10 *local_3c0;
  ulong local_3b8;
  v10 *local_3b0;
  size_t sStack_3a8;
  string *local_3a0;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *local_398 [3];
  undefined1 local_380 [16];
  v10 *local_370;
  ulong local_368;
  v10 *local_360;
  size_t sStack_358;
  string *local_350;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_348 [2];
  undefined1 local_338 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_328;
  char *local_320;
  const_reference local_318;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_310;
  char *pcStack_308;
  string *local_300;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_2f8 [3];
  undefined1 local_2e0 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_2d0;
  char *local_2c8;
  const_reference local_2c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_2b8;
  char *pcStack_2b0;
  string *local_2a8;
  v10 *local_2a0;
  v10 **local_298;
  undefined1 *local_290;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **local_288;
  v10 *local_280;
  v10 **local_278;
  v10 *local_270;
  v10 **local_268;
  v10 *local_260;
  v10 **local_258;
  v10 *local_250;
  v10 **local_248;
  v10 *local_240;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **local_238;
  v10 **local_230;
  v10 *local_228;
  size_t sStack_220;
  v10 **local_210;
  v10 *local_208;
  size_t sStack_200;
  v10 **local_1f0;
  v10 *local_1e8;
  size_t sStack_1e0;
  v10 **local_1d0;
  v10 *local_1c8;
  size_t sStack_1c0;
  v10 **local_1b0;
  v10 *local_1a8;
  size_t sStack_1a0;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_190;
  undefined1 *local_188;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_180;
  undefined1 *local_178;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_170;
  undefined1 *local_168;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_160;
  undefined1 *local_158;
  Value **local_150;
  undefined1 *local_148;
  Value **local_140;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_138;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_130;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_128;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_120;
  Value **local_118;
  undefined8 local_110;
  undefined1 *local_108;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_100;
  undefined8 local_f8;
  undefined1 *local_f0;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_e8;
  undefined8 local_e0;
  undefined1 *local_d8;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_d0;
  undefined8 local_c8;
  undefined1 *local_c0;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_b8;
  undefined8 local_b0;
  undefined1 *local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_98;
  char *pcStack_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_78;
  char *pcStack_70;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  **local_68;
  undefined1 *local_60;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  **local_58;
  undefined8 local_50;
  undefined1 *local_48;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  **local_40;
  undefined1 *local_38;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  **local_30;
  undefined8 local_28;
  undefined1 *local_20;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  **local_18;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  **local_10;
  
  local_4f9 = 0;
  pvStack_4f8 = aExpr;
  aExpr_local = (Expression *)aCommissioner;
  aCommissioner_local = (CommissionerAppPtr *)this;
  this_local = (Interpreter *)__return_storage_ptr__;
  Value::Value(__return_storage_ptr__);
  sVar2 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(pvStack_4f8);
  if (sVar2 < 2) {
    ProcessBbrDatasetJob::anon_class_1_0_00000001::operator()(&local_5a2);
    local_298 = &local_5a0;
    local_2a0 = &local_5a1;
    bVar6 = ::fmt::v10::operator()(local_2a0);
    local_598 = bVar6.size_;
    local_5a0 = (v10 *)bVar6.data_;
    ::fmt::v10::detail::check_format_string<FMT_COMPILE_STRING,_0>();
    local_350 = &local_590;
    local_360 = local_5a0;
    sStack_358 = local_598;
    local_230 = &local_360;
    local_370 = local_5a0;
    local_368 = local_598;
    local_228 = local_370;
    sStack_220 = local_368;
    local_398[0] = ::fmt::v10::
                   make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>>();
    local_188 = local_380;
    local_190 = local_398;
    local_b0 = 0;
    fmt.size_ = 0;
    fmt.data_ = (char *)local_368;
    args.field_1.values_ = in_R9.values_;
    args.desc_ = (unsigned_long_long)local_190;
    local_120 = local_190;
    local_b8 = local_190;
    local_a8 = local_188;
    ::fmt::v10::vformat_abi_cxx11_(&local_590,local_370,fmt,args);
    Error::Error(&local_570,kInvalidArgs,&local_590);
    Value::Value(&local_548,&local_570);
    Value::operator=(__return_storage_ptr__,&local_548);
    Value::~Value(&local_548);
    Error::~Error(&local_570);
    std::__cxx11::string::~string((string *)&local_590);
  }
  else {
    pvVar3 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](pvStack_4f8,1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_5d8,"get",&local_5d9);
    bVar1 = CaseInsensitiveEqual(pvVar3,&local_5d8);
    std::__cxx11::string::~string((string *)&local_5d8);
    std::allocator<char>::~allocator((allocator<char> *)&local_5d9);
    if (bVar1) {
      local_4fa = 0;
    }
    else {
      pvVar3 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](pvStack_4f8,1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_600,"set",&local_601);
      bVar1 = CaseInsensitiveEqual(pvVar3,&local_600);
      std::__cxx11::string::~string((string *)&local_600);
      std::allocator<char>::~allocator((allocator<char> *)&local_601);
      if (!bVar1) {
        ProcessBbrDatasetJob::anon_class_1_0_00000001::operator()
                  ((anon_class_1_0_00000001 *)&dataset.field_0x66);
        local_288 = &local_6a8;
        local_290 = &dataset.field_0x67;
        bVar6 = ::fmt::v10::operator()((v10 *)local_290);
        local_6a0 = (char *)bVar6.size_;
        local_6a8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)bVar6.data_
        ;
        ::fmt::v10::detail::
        check_format_string<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_FMT_COMPILE_STRING,_0>
                  ();
        local_2c0 = std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::operator[](pvStack_4f8,1);
        local_2a8 = &local_698;
        local_2b8 = local_6a8;
        pcStack_2b0 = local_6a0;
        local_a0 = &local_2b8;
        local_2d0 = local_6a8;
        local_2c8 = local_6a0;
        local_98 = local_2d0;
        pcStack_90 = local_2c8;
        local_2f8[0] = ::fmt::v10::
                       make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,std::__cxx11::string_const>
                                 ((format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                   *)local_2c0,(v10 *)local_2a8,local_6a8);
        local_60 = local_2e0;
        local_68 = local_2f8;
        local_50 = 0xd;
        fmt_00.size_ = 0xd;
        fmt_00.data_ = local_2c8;
        args_00.field_1.values_ = in_R9.values_;
        args_00.desc_ = (unsigned_long_long)local_68;
        local_58 = local_68;
        local_48 = local_60;
        local_10 = local_68;
        ::fmt::v10::vformat_abi_cxx11_(&local_698,(v10 *)local_2d0,fmt_00,args_00);
        Error::Error(&local_678,kInvalidCommand,&local_698);
        Value::Value(&local_650,&local_678);
        Value::operator=(__return_storage_ptr__,&local_650);
        Value::~Value(&local_650);
        Error::~Error(&local_678);
        std::__cxx11::string::~string((string *)&local_698);
        goto LAB_0025b87d;
      }
      local_4fa = 1;
    }
    sVar2 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(pvStack_4f8);
    if ((sVar2 == 2) && ((local_4fa & 1) == 0)) {
      BbrDataset::BbrDataset((BbrDataset *)local_718);
      peVar4 = std::
               __shared_ptr_access<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)aExpr_local);
      (*(peVar4->super_CommissionerHandler)._vptr_CommissionerHandler[0x3c])
                (&local_788,peVar4,local_718,0xffff);
      Value::Value(&local_760,&local_788);
      pVVar5 = Value::operator=(__return_storage_ptr__,&local_760);
      local_78c = kNone;
      bVar1 = Value::operator!=(pVVar5,&local_78c);
      Value::~Value(&local_760);
      Error::~Error(&local_788);
      if (!bVar1) {
        BbrDatasetToJson_abi_cxx11_(&local_7f8,(commissioner *)local_718,aDataset);
        Value::Value(&local_7d8,&local_7f8);
        Value::operator=(__return_storage_ptr__,&local_7d8);
        Value::~Value(&local_7d8);
        std::__cxx11::string::~string((string *)&local_7f8);
      }
      local_7fc = 4;
      BbrDataset::~BbrDataset((BbrDataset *)local_718);
      if (local_7fc == 0) goto LAB_0025a065;
joined_r0x0025b633:
      if (local_7fc != 4) goto LAB_0025b88e;
    }
    else {
LAB_0025a065:
      sVar2 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(pvStack_4f8);
      if (sVar2 < 3) {
        ProcessBbrDatasetJob::anon_class_1_0_00000001::operator()(&local_8a2);
        local_278 = &local_8a0;
        local_280 = &local_8a1;
        bVar6 = ::fmt::v10::operator()(local_280);
        local_898 = bVar6.size_;
        local_8a0 = (v10 *)bVar6.data_;
        ::fmt::v10::detail::check_format_string<FMT_COMPILE_STRING,_0>();
        local_3a0 = &local_890;
        local_3b0 = local_8a0;
        sStack_3a8 = local_898;
        local_210 = &local_3b0;
        local_3c0 = local_8a0;
        local_3b8 = local_898;
        local_208 = local_3c0;
        sStack_200 = local_3b8;
        local_3e8[0] = ::fmt::v10::
                       make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>>();
        local_178 = local_3d0;
        local_180 = local_3e8;
        local_c8 = 0;
        fmt_01.size_ = 0;
        fmt_01.data_ = (char *)local_3b8;
        args_01.field_1.values_ = in_R9.values_;
        args_01.desc_ = (unsigned_long_long)local_180;
        local_128 = local_180;
        local_d0 = local_180;
        local_c0 = local_178;
        ::fmt::v10::vformat_abi_cxx11_(&local_890,local_3c0,fmt_01,args_01);
        Error::Error(&local_870,kInvalidArgs,&local_890);
        Value::Value(&local_848,&local_870);
        Value::operator=(__return_storage_ptr__,&local_848);
        Value::~Value(&local_848);
        Error::~Error(&local_870);
        std::__cxx11::string::~string((string *)&local_890);
      }
      else {
        pvVar3 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[](pvStack_4f8,2);
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&local_8c8,"trihostname",
                   (allocator *)(triHostname.field_2._M_local_buf + 0xf));
        bVar1 = CaseInsensitiveEqual(pvVar3,&local_8c8);
        std::__cxx11::string::~string((string *)&local_8c8);
        std::allocator<char>::~allocator
                  ((allocator<char> *)(triHostname.field_2._M_local_buf + 0xf));
        if (bVar1) {
          std::__cxx11::string::string(local_8f0);
          if ((local_4fa & 1) == 0) {
            peVar4 = std::
                     __shared_ptr_access<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)aExpr_local);
            (*(peVar4->super_CommissionerHandler)._vptr_CommissionerHandler[0x37])
                      (&local_a80,peVar4,local_8f0);
            Value::Value(&local_a58,&local_a80);
            pVVar5 = Value::operator=(__return_storage_ptr__,&local_a58);
            local_a84 = kNone;
            bVar1 = Value::operator!=(pVVar5,&local_a84);
            Value::~Value(&local_a58);
            Error::~Error(&local_a80);
            if (bVar1) {
              local_7fc = 4;
            }
            else {
              std::__cxx11::string::string((string *)&local_af0,local_8f0);
              Value::Value(&local_ad0,&local_af0);
              Value::operator=(__return_storage_ptr__,&local_ad0);
              Value::~Value(&local_ad0);
              std::__cxx11::string::~string((string *)&local_af0);
LAB_0025a88d:
              local_7fc = 0;
            }
          }
          else {
            sVar2 = std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::size(pvStack_4f8);
            if (sVar2 < 4) {
              ProcessBbrDatasetJob::anon_class_1_0_00000001::operator()(&local_992);
              local_268 = &local_990;
              local_270 = &local_991;
              bVar6 = ::fmt::v10::operator()(local_270);
              local_988 = bVar6.size_;
              local_990 = (v10 *)bVar6.data_;
              ::fmt::v10::detail::check_format_string<FMT_COMPILE_STRING,_0>();
              local_3f0 = &local_980;
              local_400 = local_990;
              sStack_3f8 = local_988;
              local_1f0 = &local_400;
              local_410 = local_990;
              local_408 = local_988;
              local_1e8 = local_410;
              sStack_1e0 = local_408;
              local_438[0] = ::fmt::v10::
                             make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>>
                                       ();
              local_168 = local_420;
              local_170 = local_438;
              local_e0 = 0;
              fmt_02.size_ = 0;
              fmt_02.data_ = (char *)local_408;
              args_02.field_1.values_ = in_R9.values_;
              args_02.desc_ = (unsigned_long_long)local_170;
              local_130 = local_170;
              local_e8 = local_170;
              local_d8 = local_168;
              ::fmt::v10::vformat_abi_cxx11_(&local_980,local_410,fmt_02,args_02);
              Error::Error(&local_960,kInvalidArgs,&local_980);
              Value::Value(&local_938,&local_960);
              Value::operator=(__return_storage_ptr__,&local_938);
              Value::~Value(&local_938);
              Error::~Error(&local_960);
              std::__cxx11::string::~string((string *)&local_980);
              local_7fc = 4;
            }
            else {
              peVar4 = std::
                       __shared_ptr_access<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       ::operator->((__shared_ptr_access<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                     *)aExpr_local);
              pvVar3 = std::
                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::operator[](pvStack_4f8,3);
              (*(peVar4->super_CommissionerHandler)._vptr_CommissionerHandler[0x38])
                        (&local_a08,peVar4,pvVar3);
              Value::Value(&local_9e0,&local_a08);
              pVVar5 = Value::operator=(__return_storage_ptr__,&local_9e0);
              local_a0c = kNone;
              bVar1 = Value::operator!=(pVVar5,&local_a0c);
              Value::~Value(&local_9e0);
              Error::~Error(&local_a08);
              if (!bVar1) goto LAB_0025a88d;
              local_7fc = 4;
            }
          }
          std::__cxx11::string::~string(local_8f0);
        }
        else {
          pvVar3 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[](pvStack_4f8,2);
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    ((string *)&local_b10,"reghostname",
                     (allocator *)(regHostname.field_2._M_local_buf + 0xf));
          bVar1 = CaseInsensitiveEqual(pvVar3,&local_b10);
          std::__cxx11::string::~string((string *)&local_b10);
          std::allocator<char>::~allocator
                    ((allocator<char> *)(regHostname.field_2._M_local_buf + 0xf));
          if (bVar1) {
            std::__cxx11::string::string(local_b38);
            if ((local_4fa & 1) == 0) {
              peVar4 = std::
                       __shared_ptr_access<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       ::operator->((__shared_ptr_access<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                     *)aExpr_local);
              (*(peVar4->super_CommissionerHandler)._vptr_CommissionerHandler[0x39])
                        (&local_cc8,peVar4,local_b38);
              Value::Value(&local_ca0,&local_cc8);
              pVVar5 = Value::operator=(__return_storage_ptr__,&local_ca0);
              local_ccc = kNone;
              bVar1 = Value::operator!=(pVVar5,&local_ccc);
              Value::~Value(&local_ca0);
              Error::~Error(&local_cc8);
              if (bVar1) {
                local_7fc = 4;
              }
              else {
                std::__cxx11::string::string((string *)&local_d38,local_b38);
                Value::Value(&local_d18,&local_d38);
                Value::operator=(__return_storage_ptr__,&local_d18);
                Value::~Value(&local_d18);
                std::__cxx11::string::~string((string *)&local_d38);
LAB_0025aeb0:
                local_7fc = 0;
              }
            }
            else {
              sVar2 = std::
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::size(pvStack_4f8);
              if (sVar2 < 4) {
                ProcessBbrDatasetJob::anon_class_1_0_00000001::operator()(&local_bda);
                local_258 = &local_bd8;
                local_260 = &local_bd9;
                bVar6 = ::fmt::v10::operator()(local_260);
                local_bd0 = bVar6.size_;
                local_bd8 = (v10 *)bVar6.data_;
                ::fmt::v10::detail::check_format_string<FMT_COMPILE_STRING,_0>();
                local_440 = &local_bc8;
                local_450 = local_bd8;
                sStack_448 = local_bd0;
                local_1d0 = &local_450;
                local_460 = local_bd8;
                local_458 = local_bd0;
                local_1c8 = local_460;
                sStack_1c0 = local_458;
                local_488[0] = ::fmt::v10::
                               make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>>
                                         ();
                local_158 = local_470;
                local_160 = local_488;
                local_f8 = 0;
                fmt_03.size_ = 0;
                fmt_03.data_ = (char *)local_458;
                args_03.field_1.values_ = in_R9.values_;
                args_03.desc_ = (unsigned_long_long)local_160;
                local_138 = local_160;
                local_100 = local_160;
                local_f0 = local_158;
                ::fmt::v10::vformat_abi_cxx11_(&local_bc8,local_460,fmt_03,args_03);
                Error::Error(&local_ba8,kInvalidArgs,&local_bc8);
                Value::Value(&local_b80,&local_ba8);
                Value::operator=(__return_storage_ptr__,&local_b80);
                Value::~Value(&local_b80);
                Error::~Error(&local_ba8);
                std::__cxx11::string::~string((string *)&local_bc8);
                local_7fc = 4;
              }
              else {
                peVar4 = std::
                         __shared_ptr_access<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         ::operator->((__shared_ptr_access<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                       *)aExpr_local);
                pvVar3 = std::
                         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ::operator[](pvStack_4f8,3);
                (*(peVar4->super_CommissionerHandler)._vptr_CommissionerHandler[0x3a])
                          (&local_c50,peVar4,pvVar3);
                Value::Value(&local_c28,&local_c50);
                pVVar5 = Value::operator=(__return_storage_ptr__,&local_c28);
                local_c54 = kNone;
                bVar1 = Value::operator!=(pVVar5,&local_c54);
                Value::~Value(&local_c28);
                Error::~Error(&local_c50);
                if (!bVar1) goto LAB_0025aeb0;
                local_7fc = 4;
              }
            }
            std::__cxx11::string::~string(local_b38);
          }
          else {
            pvVar3 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::operator[](pvStack_4f8,2);
            std::allocator<char>::allocator();
            std::__cxx11::string::string
                      ((string *)&local_d58,"regaddr",
                       (allocator *)(regAddr.field_2._M_local_buf + 0xf));
            bVar1 = CaseInsensitiveEqual(pvVar3,&local_d58);
            std::__cxx11::string::~string((string *)&local_d58);
            std::allocator<char>::~allocator
                      ((allocator<char> *)(regAddr.field_2._M_local_buf + 0xf));
            if (bVar1) {
              std::__cxx11::string::string(local_d80);
              if ((local_4fa & 1) == 0) {
                peVar4 = std::
                         __shared_ptr_access<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         ::operator->((__shared_ptr_access<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                       *)aExpr_local);
                (*(peVar4->super_CommissionerHandler)._vptr_CommissionerHandler[0x3b])
                          (&local_e98,peVar4,local_d80);
                Value::Value(&local_e70,&local_e98);
                pVVar5 = Value::operator=(__return_storage_ptr__,&local_e70);
                local_e9c = kNone;
                bVar1 = Value::operator!=(pVVar5,&local_e9c);
                Value::~Value(&local_e70);
                Error::~Error(&local_e98);
                if (bVar1) {
                  local_7fc = 4;
                }
                else {
                  std::__cxx11::string::string((string *)&dataset_1.mPresentFlags,local_d80);
                  Value::Value(&local_ee8,(string *)&dataset_1.mPresentFlags);
                  Value::operator=(__return_storage_ptr__,&local_ee8);
                  Value::~Value(&local_ee8);
                  std::__cxx11::string::~string((string *)&dataset_1.mPresentFlags);
                  local_7fc = 0;
                }
              }
              else {
                ProcessBbrDatasetJob::anon_class_1_0_00000001::operator()(&local_e22);
                local_248 = &local_e20;
                local_250 = &local_e21;
                bVar6 = ::fmt::v10::operator()(local_250);
                local_e18 = bVar6.size_;
                local_e20 = (v10 *)bVar6.data_;
                ::fmt::v10::detail::check_format_string<FMT_COMPILE_STRING,_0>();
                local_490 = &local_e10;
                local_4a0 = local_e20;
                sStack_498 = local_e18;
                local_1b0 = &local_4a0;
                local_4b0 = local_e20;
                local_4a8 = local_e18;
                local_1a8 = local_4b0;
                sStack_1a0 = local_4a8;
                value = (Value *)::fmt::v10::
                                 make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>>
                                           ();
                local_148 = local_4c0;
                local_150 = &value;
                local_110 = 0;
                fmt_04.size_ = 0;
                fmt_04.data_ = (char *)local_4a8;
                args_04.field_1.values_ = in_R9.values_;
                args_04.desc_ = (unsigned_long_long)local_150;
                local_140 = local_150;
                local_118 = local_150;
                local_108 = local_148;
                ::fmt::v10::vformat_abi_cxx11_(&local_e10,local_4b0,fmt_04,args_04);
                Error::Error(&local_df0,kInvalidArgs,&local_e10);
                Value::Value(&local_dc8,&local_df0);
                Value::operator=(__return_storage_ptr__,&local_dc8);
                Value::~Value(&local_dc8);
                Error::~Error(&local_df0);
                std::__cxx11::string::~string((string *)&local_e10);
                local_7fc = 4;
              }
              std::__cxx11::string::~string(local_d80);
            }
            else {
              if ((local_4fa & 1) == 0) {
                ProcessBbrDatasetJob::anon_class_1_0_00000001::operator()(&local_1102);
                local_238 = &local_1100;
                local_240 = &local_1101;
                bVar6 = ::fmt::v10::operator()(local_240);
                local_10f8 = (char *)bVar6.size_;
                local_1100 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             bVar6.data_;
                ::fmt::v10::detail::
                check_format_string<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_FMT_COMPILE_STRING,_0>
                          ();
                local_318 = std::
                            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ::operator[](pvStack_4f8,2);
                local_300 = &local_10f0;
                local_310 = local_1100;
                pcStack_308 = local_10f8;
                local_80 = &local_310;
                local_328 = local_1100;
                local_320 = local_10f8;
                local_78 = local_328;
                pcStack_70 = local_320;
                local_348[0] = ::fmt::v10::
                               make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,std::__cxx11::string_const>
                                         ((format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                           *)local_318,(v10 *)local_300,local_1100);
                local_38 = local_338;
                local_40 = local_348;
                local_28 = 0xd;
                fmt_05.size_ = 0xd;
                fmt_05.data_ = local_320;
                args_05.field_1.values_ = in_R9.values_;
                args_05.desc_ = (unsigned_long_long)local_40;
                local_30 = local_40;
                local_20 = local_38;
                local_18 = local_40;
                ::fmt::v10::vformat_abi_cxx11_(&local_10f0,(v10 *)local_328,fmt_05,args_05);
                Error::Error(&local_10d0,kInvalidArgs,&local_10f0);
                Value::Value(&local_10a8,&local_10d0);
                Value::operator=(__return_storage_ptr__,&local_10a8);
                Value::~Value(&local_10a8);
                Error::~Error(&local_10d0);
                std::__cxx11::string::~string((string *)&local_10f0);
                goto LAB_0025b87d;
              }
              BbrDataset::BbrDataset((BbrDataset *)local_f70);
              pvVar3 = std::
                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::operator[](pvStack_4f8,2);
              BbrDatasetFromJson(&local_fe0,(BbrDataset *)local_f70,pvVar3);
              Value::Value(&local_fb8,&local_fe0);
              pVVar5 = Value::operator=(__return_storage_ptr__,&local_fb8);
              local_fe4 = kNone;
              bVar1 = Value::operator!=(pVVar5,&local_fe4);
              Value::~Value(&local_fb8);
              Error::~Error(&local_fe0);
              if (bVar1) {
                local_7fc = 4;
              }
              else {
                peVar4 = std::
                         __shared_ptr_access<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         ::operator->((__shared_ptr_access<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                       *)aExpr_local);
                (*(peVar4->super_CommissionerHandler)._vptr_CommissionerHandler[0x3d])
                          (&local_1058,peVar4,local_f70);
                Value::Value(&local_1030,&local_1058);
                pVVar5 = Value::operator=(__return_storage_ptr__,&local_1030);
                local_105c = kNone;
                bVar1 = Value::operator!=(pVVar5,&local_105c);
                Value::~Value(&local_1030);
                Error::~Error(&local_1058);
                if (bVar1) {
                  local_7fc = 4;
                }
                else {
                  local_7fc = 0;
                }
              }
              BbrDataset::~BbrDataset((BbrDataset *)local_f70);
            }
          }
        }
        if (local_7fc != 0) goto joined_r0x0025b633;
      }
    }
  }
LAB_0025b87d:
  local_4f9 = 1;
  local_7fc = 1;
LAB_0025b88e:
  if ((local_4f9 & 1) == 0) {
    Value::~Value(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

Interpreter::Value Interpreter::ProcessBbrDatasetJob(CommissionerAppPtr &aCommissioner, const Expression &aExpr)
{
    Value value;
    bool  isSet;

    VerifyOrExit(aExpr.size() >= 2, value = ERROR_INVALID_ARGS(SYNTAX_FEW_ARGS));
    if (CaseInsensitiveEqual(aExpr[1], "get"))
    {
        isSet = false;
    }
    else if (CaseInsensitiveEqual(aExpr[1], "set"))
    {
        isSet = true;
    }
    else
    {
        ExitNow(value = ERROR_INVALID_COMMAND(SYNTAX_INVALID_SUBCOMMAND, aExpr[1]));
    }

    if (aExpr.size() == 2 && !isSet)
    {
        BbrDataset dataset;
        SuccessOrExit(value = aCommissioner->GetBbrDataset(dataset, 0xFFFF));
        ExitNow(value = BbrDatasetToJson(dataset));
    }

    VerifyOrExit(aExpr.size() >= 3, value = ERROR_INVALID_ARGS(SYNTAX_FEW_ARGS));

    if (CaseInsensitiveEqual(aExpr[2], "trihostname"))
    {
        std::string triHostname;
        if (isSet)
        {
            VerifyOrExit(aExpr.size() >= 4, value = ERROR_INVALID_ARGS(SYNTAX_FEW_ARGS));
            SuccessOrExit(value = aCommissioner->SetTriHostname(aExpr[3]));
        }
        else
        {
            SuccessOrExit(value = aCommissioner->GetTriHostname(triHostname));
            value = triHostname;
        }
    }
    else if (CaseInsensitiveEqual(aExpr[2], "reghostname"))
    {
        std::string regHostname;
        if (isSet)
        {
            VerifyOrExit(aExpr.size() >= 4, value = ERROR_INVALID_ARGS(SYNTAX_FEW_ARGS));
            SuccessOrExit(value = aCommissioner->SetRegistrarHostname(aExpr[3]));
        }
        else
        {
            SuccessOrExit(value = aCommissioner->GetRegistrarHostname(regHostname));
            value = regHostname;
        }
    }
    else if (CaseInsensitiveEqual(aExpr[2], "regaddr"))
    {
        std::string regAddr;
        VerifyOrExit(!isSet, value = ERROR_INVALID_ARGS("cannot set  read-only Registrar Address"));
        SuccessOrExit(value = aCommissioner->GetRegistrarIpv6Addr(regAddr));
        value = regAddr;
    }
    else
    {
        if (isSet)
        {
            BbrDataset dataset;
            SuccessOrExit(value = BbrDatasetFromJson(dataset, aExpr[2]));
            SuccessOrExit(value = aCommissioner->SetBbrDataset(dataset));
        }
        else
        {
            value = ERROR_INVALID_ARGS("{} is not a valid BBR Dataset field", aExpr[2]);
        }
    }

exit:
    return value;
}